

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O1

bool __thiscall llvm::Twine::isValid(Twine *this)

{
  NodeKind NVar1;
  NodeKind NVar2;
  
  NVar1 = this->LHSKind;
  if ((((NVar1 < TwineKind) && (this->RHSKind != EmptyKind)) ||
      (NVar2 = this->RHSKind, NVar2 == NullKind)) || ((NVar2 != EmptyKind && (NVar1 == EmptyKind))))
  {
    return false;
  }
  if (NVar1 == TwineKind) {
    if (((this->LHS).twine)->LHSKind == NullKind) {
      return false;
    }
    if (((this->LHS).twine)->RHSKind == EmptyKind) {
      return false;
    }
  }
  if (NVar2 == TwineKind) {
    if (((this->RHS).twine)->LHSKind == NullKind) {
      return false;
    }
    if (((this->RHS).twine)->RHSKind == EmptyKind) {
      return false;
    }
  }
  return true;
}

Assistant:

NodeKind getLHSKind() const { return LHSKind; }